

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O3

int ASN1_item_ex_new(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ASN1_VALUE **pval_00;
  ASN1_VALUE *pAVar4;
  long lVar5;
  ASN1_TEMPLATE *tt;
  code *pcVar6;
  
  iVar3 = 1;
  switch(it->itype) {
  case '\0':
    if ((ASN1_TEMPLATE *)it->utype == (ASN1_TEMPLATE *)0x0) goto switchD_004467fe_caseD_5;
    iVar2 = ASN1_template_new(pval,(ASN1_TEMPLATE *)it->utype);
    break;
  case '\x01':
    bVar1 = true;
    if ((it->tcount == 0) || (pcVar6 = *(code **)(it->tcount + 0x10), pcVar6 == (code *)0x0)) {
      pcVar6 = (code *)0x0;
    }
    else {
      bVar1 = false;
      iVar3 = (*pcVar6)(0,pval,it,0);
      if (iVar3 == 0) goto LAB_004469af;
      if (iVar3 == 2) {
        return 1;
      }
    }
    pAVar4 = (ASN1_VALUE *)OPENSSL_zalloc((size_t)it->funcs);
    *pval = pAVar4;
    if (pAVar4 != (ASN1_VALUE *)0x0) {
      asn1_refcount_set_one((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
      asn1_enc_init(pval,it);
      if (0 < (long)it->templates) {
        tt = (ASN1_TEMPLATE *)it->utype;
        lVar5 = 0;
        do {
          pval_00 = asn1_get_field_ptr(pval,tt);
          iVar3 = ASN1_template_new(pval_00,tt);
          if (iVar3 == 0) {
            ASN1_item_ex_free(pval,it);
            goto LAB_004469dc;
          }
          tt = (ASN1_TEMPLATE *)&tt->item;
          lVar5 = lVar5 + 1;
        } while (lVar5 < (long)it->templates);
      }
      if (bVar1) {
        return 1;
      }
      iVar3 = (*pcVar6)(1,pval,it,0);
LAB_004469a0:
      if (iVar3 != 0) {
        return 1;
      }
      ASN1_item_ex_free(pval,it);
LAB_004469af:
      ERR_put_error(0xc,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_new.cc"
                    ,0x8b);
      return 0;
    }
    goto LAB_004469dc;
  case '\x02':
    bVar1 = true;
    if ((it->tcount == 0) || (pcVar6 = *(code **)(it->tcount + 0x10), pcVar6 == (code *)0x0)) {
      pcVar6 = (code *)0x0;
    }
    else {
      bVar1 = false;
      iVar3 = (*pcVar6)(0,pval,it,0);
      if (iVar3 == 0) goto LAB_004469af;
      if (iVar3 == 2) {
        return 1;
      }
    }
    pAVar4 = (ASN1_VALUE *)OPENSSL_zalloc((size_t)it->funcs);
    *pval = pAVar4;
    if (pAVar4 != (ASN1_VALUE *)0x0) {
      asn1_set_choice_selector(pval,-1,it);
      if (bVar1) {
        return 1;
      }
      iVar3 = (*pcVar6)(1,pval,it,0);
      goto LAB_004469a0;
    }
    goto LAB_004469dc;
  default:
    goto switchD_004467fe_caseD_3;
  case '\x04':
    if ((undefined8 *)it->tcount == (undefined8 *)0x0) {
      return 1;
    }
    pcVar6 = *(code **)it->tcount;
    if (pcVar6 == (code *)0x0) {
      return 1;
    }
    iVar2 = (*pcVar6)(pval,it);
    break;
  case '\x05':
switchD_004467fe_caseD_5:
    iVar2 = ASN1_primitive_new(pval,it);
  }
  if (iVar2 == 0) {
LAB_004469dc:
    iVar3 = 0;
  }
switchD_004467fe_caseD_3:
  return iVar3;
}

Assistant:

int ASN1_item_ex_new(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  const ASN1_TEMPLATE *tt = NULL;
  const ASN1_EXTERN_FUNCS *ef;
  ASN1_VALUE **pseqval;
  int i;

  switch (it->itype) {
    case ASN1_ITYPE_EXTERN:
      ef = reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      if (ef && ef->asn1_ex_new) {
        if (!ef->asn1_ex_new(pval, it)) {
          goto memerr;
        }
      }
      break;

    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        if (!ASN1_template_new(pval, it->templates)) {
          goto memerr;
        }
      } else if (!ASN1_primitive_new(pval, it)) {
        goto memerr;
      }
      break;

    case ASN1_ITYPE_MSTRING:
      if (!ASN1_primitive_new(pval, it)) {
        goto memerr;
      }
      break;

    case ASN1_ITYPE_CHOICE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
        if (!i) {
          goto auxerr;
        }
        if (i == 2) {
          return 1;
        }
      }
      *pval = reinterpret_cast<ASN1_VALUE *>(OPENSSL_zalloc(it->size));
      if (!*pval) {
        goto memerr;
      }
      asn1_set_choice_selector(pval, -1, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL)) {
        goto auxerr2;
      }
      break;
    }

    case ASN1_ITYPE_SEQUENCE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        i = asn1_cb(ASN1_OP_NEW_PRE, pval, it, NULL);
        if (!i) {
          goto auxerr;
        }
        if (i == 2) {
          return 1;
        }
      }
      *pval = reinterpret_cast<ASN1_VALUE *>(OPENSSL_zalloc(it->size));
      if (!*pval) {
        goto memerr;
      }
      asn1_refcount_set_one(pval, it);
      asn1_enc_init(pval, it);
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        pseqval = asn1_get_field_ptr(pval, tt);
        if (!ASN1_template_new(pseqval, tt)) {
          goto memerr2;
        }
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_NEW_POST, pval, it, NULL)) {
        goto auxerr2;
      }
      break;
    }
  }
  return 1;

memerr2:
  ASN1_item_ex_free(pval, it);
memerr:
  return 0;

auxerr2:
  ASN1_item_ex_free(pval, it);
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
  return 0;
}